

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  _Alloc_hider _Var4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  anon_class_4_1_a88e3f2b *paVar11;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  *this;
  anon_class_1_0_00000001 *in_R8;
  anon_class_4_1_a88e3f2b *paVar12;
  anon_class_4_1_a88e3f2b *in_R9;
  ifstream *piVar13;
  float fVar14;
  float fVar15;
  value_t local_360;
  float local_35c;
  char *local_358;
  anon_class_4_1_a88e3f2b output_pair;
  string parameter;
  pointer ppfStack_328;
  long local_310;
  long local_308;
  int local_300;
  file_format local_2fc;
  float local_2f8;
  size_t next_pos;
  Sparse_distance_matrix<Params> local_2c8;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_2a8;
  undefined8 uStack_290;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_288;
  undefined8 uStack_270;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> local_268;
  ifstream file_stream;
  byte abStack_218 [488];
  
  local_2f8 = 1.0;
  local_360 = 3.4028235e+38;
  local_308 = 1;
  local_358 = (char *)0x0;
  local_300 = -1;
  local_2fc = DISTANCE_MATRIX;
  local_310 = 2;
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file_stream,argv[iVar8],(allocator<char> *)&parameter);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--help");
    if (bVar2) {
      local_300 = 0;
LAB_001037e2:
      print_usage_and_exit(local_300);
LAB_001037eb:
      print_usage_and_exit(-1);
LAB_001037f3:
      print_usage_and_exit(-1);
LAB_001037fb:
      print_usage_and_exit(-1);
LAB_00103803:
      print_usage_and_exit(-1);
      goto LAB_0010380b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--dim");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameter,argv[(long)iVar8 + 1],(allocator<char> *)&next_pos);
      local_308 = std::__cxx11::stol(&parameter,&next_pos,10);
      if (next_pos == parameter._M_string_length) goto LAB_00103255;
      goto LAB_001037eb;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--threshold");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameter,argv[(long)iVar8 + 1],(allocator<char> *)&next_pos);
      local_360 = std::__cxx11::stof(&parameter,&next_pos);
      if (next_pos == parameter._M_string_length) goto LAB_00103255;
      goto LAB_001037f3;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--ratio");
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &file_stream,"--format");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parameter,argv[(long)iVar8 + 1],(allocator<char> *)&next_pos);
        lVar3 = std::__cxx11::string::rfind((char *)&parameter,0x1395e7);
        if (lVar3 == 0) {
          local_2fc = LOWER_DISTANCE_MATRIX;
        }
        else {
          lVar3 = std::__cxx11::string::rfind((char *)&parameter,0x1395ed);
          local_2fc = UPPER_DISTANCE_MATRIX;
          if (lVar3 != 0) {
            lVar3 = std::__cxx11::string::rfind((char *)&parameter,0x1395f3);
            local_2fc = DISTANCE_MATRIX;
            if (lVar3 != 0) {
              lVar3 = std::__cxx11::string::rfind((char *)&parameter,0x1395f8);
              local_2fc = POINT_CLOUD;
              if (lVar3 != 0) {
                bVar2 = std::operator==(&parameter,"dipha");
                local_2fc = DIPHA;
                if (!bVar2) {
                  bVar2 = std::operator==(&parameter,"sparse");
                  local_2fc = SPARSE;
                  if (!bVar2) {
                    bVar2 = std::operator==(&parameter,"binary");
                    local_2fc = BINARY;
                    if (!bVar2) {
                      print_usage_and_exit(-1);
                      std::__cxx11::string::~string((string *)&parameter);
                      std::__cxx11::string::~string((string *)&file_stream);
                      _Unwind_Resume(extraout_RAX);
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_00103255;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &file_stream,"--modulus");
      if (!bVar2) {
        if (local_358 != (char *)0x0) goto LAB_001037e2;
        local_358 = argv[iVar8];
        goto LAB_0010325f;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameter,argv[(long)iVar8 + 1],(allocator<char> *)&next_pos);
      local_310 = std::__cxx11::stol(&parameter,&next_pos,10);
      if ((next_pos == parameter._M_string_length) &&
         (bVar2 = Gudhi::ripser::is_prime<unsigned_int>((uint)local_310), bVar2)) goto LAB_00103255;
      goto LAB_00103803;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameter,argv[(long)iVar8 + 1],(allocator<char> *)&next_pos);
    local_2f8 = std::__cxx11::stof(&parameter,&next_pos);
    if (next_pos != parameter._M_string_length) goto LAB_001037fb;
LAB_00103255:
    iVar8 = iVar8 + 1;
    std::__cxx11::string::~string((string *)&parameter);
LAB_0010325f:
    std::__cxx11::string::~string((string *)&file_stream);
  }
  piVar13 = &file_stream;
  std::ifstream::ifstream(piVar13,local_358,_S_in);
  if ((local_358 != (char *)0x0) && ((abStack_218[*(long *)(_file_stream + -0x18)] & 5) != 0)) {
LAB_0010380b:
    poVar5 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
    poVar5 = std::operator<<(poVar5,local_358);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(-1);
  }
  output_pair.ratio = local_2f8;
  iVar8 = (int)local_310;
  if (local_2fc == POINT_CLOUD) {
    if (3.4028235e+38 <= local_360) goto LAB_001033eb;
    if (local_358 == (char *)0x0) {
      piVar13 = (ifstream *)&std::cin;
    }
    else {
      piVar13 = &file_stream;
    }
    read_point_cloud((Euclidean_distance_matrix *)&next_pos,(istream *)piVar13);
    Gudhi::ripser::Sparse_distance_matrix<Params>::
    Sparse_distance_matrix<Gudhi::ripser::Euclidean_distance_matrix<Params>>
              ((Sparse_distance_matrix<Params> *)&parameter,
               (Euclidean_distance_matrix<Params> *)&next_pos,local_360);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&next_pos);
    local_2a8.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)parameter._M_dataplus._M_p;
    local_2a8.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)parameter._M_string_length;
    local_2a8.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)parameter.field_2._M_allocated_capacity;
    uStack_290 = parameter.field_2._8_8_;
    parameter._M_dataplus._M_p = (pointer)0x0;
    parameter._M_string_length = 0;
    parameter.field_2._M_allocated_capacity = 0;
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)&local_2a8,
               (Sparse_distance_matrix<Params> *)(ulong)(uint)(int)(char)local_308,iVar8,local_360,
               (uint)&output_pair,in_R8,in_R9);
    this = &local_2a8;
  }
  else {
    if (local_2fc != SPARSE) {
LAB_001033eb:
      if (local_358 == (char *)0x0) {
        piVar13 = (ifstream *)&std::cin;
      }
      else {
        piVar13 = &file_stream;
      }
      read_file((Compressed_lower_distance_matrix *)&parameter,(istream *)piVar13,local_2fc);
      local_35c = INFINITY;
      local_358._0_4_ = INFINITY;
      if (3.4028235e+38 <= local_360) {
        uVar7 = 0;
        uVar6 = (uint)((ulong)((long)ppfStack_328 - parameter.field_2._8_8_) >> 3);
        uVar9 = 0;
        if (0 < (int)uVar6) {
          uVar9 = uVar6;
        }
        local_358._0_4_ = INFINITY;
        for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
          fVar14 = -INFINITY;
          paVar11 = (anon_class_4_1_a88e3f2b *)0x0;
          while (uVar10 = (uint)paVar11, uVar6 != uVar10) {
            fVar15 = 0.0;
            if (uVar7 != uVar10) {
              paVar12 = paVar11;
              if ((int)uVar10 < (int)uVar7) {
                paVar12 = (anon_class_4_1_a88e3f2b *)(ulong)uVar7;
              }
              if ((int)uVar7 < (int)uVar10) {
                paVar11 = (anon_class_4_1_a88e3f2b *)(ulong)uVar7;
              }
              in_R8 = *(anon_class_1_0_00000001 **)(parameter.field_2._8_8_ + (long)paVar12 * 8);
              fVar15 = *(float *)(in_R8 + (long)paVar11 * 4);
              in_R9 = paVar11;
            }
            if (fVar15 <= fVar14) {
              fVar15 = fVar14;
            }
            fVar14 = fVar15;
            paVar11 = (anon_class_4_1_a88e3f2b *)(ulong)(uVar10 + 1);
          }
          if (local_358._0_4_ <= fVar14) {
            fVar14 = local_358._0_4_;
          }
          local_358._0_4_ = fVar14;
        }
      }
      local_2f8 = -INFINITY;
      for (_Var4 = parameter._M_dataplus; _Var4._M_p != (pointer)parameter._M_string_length;
          _Var4._M_p = _Var4._M_p + 4) {
        fVar14 = *(float *)_Var4._M_p;
        fVar15 = fVar14;
        if (fVar14 == INFINITY || fVar14 <= local_2f8) {
          fVar15 = local_2f8;
        }
        if (local_35c <= fVar14) {
          fVar14 = local_35c;
        }
        local_35c = fVar14;
        local_2f8 = fVar15;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"value range: [");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_35c);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2f8);
      poVar5 = std::operator<<(poVar5,"]");
      std::endl<char,std::char_traits<char>>(poVar5);
      if (3.4028235e+38 <= local_360) {
        poVar5 = std::operator<<((ostream *)&std::cout,"distance matrix with ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(int)((ulong)((long)ppfStack_328 - parameter.field_2._8_8_) >> 3)
                           );
        poVar5 = std::operator<<(poVar5," points, using threshold at enclosing radius ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_358._0_4_);
        std::endl<char,std::char_traits<char>>(poVar5);
        local_268.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)parameter._M_dataplus._M_p;
        local_268.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)parameter._M_string_length;
        local_268.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)parameter.field_2._M_allocated_capacity
        ;
        parameter._M_dataplus._M_p = (pointer)0x0;
        parameter._M_string_length = 0;
        parameter.field_2._M_allocated_capacity = 0;
        local_268.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)parameter.field_2._8_8_;
        parameter.field_2._8_8_ = 0;
        Gudhi::ripser::
        ripser<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                  ((ripser *)&local_268,
                   (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *
                   )(ulong)(uint)(int)(char)local_308,iVar8,local_358._0_4_,(uint)&output_pair,in_R8
                   ,in_R9);
        Gudhi::ripser::
        Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
        ~Compressed_distance_matrix(&local_268);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"sparse distance matrix with ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(int)((ulong)((long)ppfStack_328 - parameter.field_2._8_8_) >> 3)
                           );
        poVar5 = std::operator<<(poVar5," points and ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"/");
        iVar1 = (int)((ulong)((long)ppfStack_328 - parameter.field_2._8_8_) >> 3);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,((iVar1 + -1) * iVar1) / 2);
        poVar5 = std::operator<<(poVar5," entries");
        std::endl<char,std::char_traits<char>>(poVar5);
        Gudhi::ripser::Sparse_distance_matrix<Params>::
        Sparse_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>>
                  (&local_2c8,
                   (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *
                   )&parameter,local_360);
        Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                  ((ripser *)&local_2c8,
                   (Sparse_distance_matrix<Params> *)(ulong)(uint)(int)(char)local_308,iVar8,
                   local_360,(uint)&output_pair,in_R8,in_R9);
        std::
        vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
        ::~vector(&local_2c8.neighbors);
      }
      Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
      ::~Compressed_distance_matrix
                ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *)
                 &parameter);
      goto LAB_001037b9;
    }
    if (local_358 == (char *)0x0) {
      piVar13 = (ifstream *)&std::cin;
    }
    read_sparse_distance_matrix((Sparse_distance_matrix *)&parameter,(istream *)piVar13);
    poVar5 = std::operator<<((ostream *)&std::cout,"sparse distance matrix with ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(int)((long)(parameter._M_string_length -
                                           (long)parameter._M_dataplus._M_p) / 0x18));
    poVar5 = std::operator<<(poVar5," points and ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"/");
    iVar1 = (int)((long)(parameter._M_string_length - (long)parameter._M_dataplus._M_p) / 0x18);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(iVar1 * (iVar1 + -1)) / 2);
    poVar5 = std::operator<<(poVar5," entries");
    std::endl<char,std::char_traits<char>>(poVar5);
    local_288.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)parameter._M_dataplus._M_p;
    local_288.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)parameter._M_string_length;
    local_288.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)parameter.field_2._M_allocated_capacity;
    uStack_270 = parameter.field_2._8_8_;
    parameter._M_dataplus._M_p = (pointer)0x0;
    parameter._M_string_length = 0;
    parameter.field_2._M_allocated_capacity = 0;
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)&local_288,
               (Sparse_distance_matrix<Params> *)(ulong)(uint)(int)(char)local_308,iVar8,local_360,
               (uint)&output_pair,in_R8,in_R9);
    this = &local_288;
  }
  std::
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ::~vector(this);
  std::
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ::~vector((vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
             *)&parameter);
LAB_001037b9:
  std::ifstream::~ifstream(&file_stream);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* filename = nullptr;

  file_format format = DISTANCE_MATRIX;

  dimension_t dim_max = 1;
  value_t threshold = std::numeric_limits<value_t>::max();
  float ratio = 1;
  coefficient_t modulus = 2;

  for (int i = 1; i < argc; ++i) {
    const std::string arg(argv[i]);
    if (arg == "--help") {
      print_usage_and_exit(0);
    } else if (arg == "--dim") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      dim_max = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--threshold") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      threshold = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--ratio") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      ratio = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--format") {
      std::string parameter = std::string(argv[++i]);
      if (parameter.rfind("lower", 0) == 0)
        format = LOWER_DISTANCE_MATRIX;
      else if (parameter.rfind("upper", 0) == 0)
        format = UPPER_DISTANCE_MATRIX;
      else if (parameter.rfind("dist", 0) == 0)
        format = DISTANCE_MATRIX;
      else if (parameter.rfind("point", 0) == 0)
        format = POINT_CLOUD;
      else if (parameter == "dipha")
        format = DIPHA;
      else if (parameter == "sparse")
        format = SPARSE;
      else if (parameter == "binary")
        format = BINARY;
      else
        print_usage_and_exit(-1);
    } else if (arg == "--modulus") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      modulus = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size() || !Gudhi::ripser::is_prime(modulus)) print_usage_and_exit(-1);
    } else {
      if (filename) { print_usage_and_exit(-1); }
      filename = argv[i];
    }
  }

  std::ifstream file_stream(filename);
  if (filename && file_stream.fail()) {
    std::cerr << "couldn't open file " << filename << std::endl;
    exit(-1);
  }

  auto output_dim = [](dimension_t dim) {
    std::cout << "persistence intervals in dim " << (int)dim << ":" << std::endl;
  };
  auto output_pair = [ratio](value_t birth, value_t death) {
#ifdef GUDHI_INDICATE_PROGRESS
    // Not necessary if we redirect stdout
    std::cerr << Gudhi::ripser::clear_line << std::flush;
#endif
    if (death == std::numeric_limits<value_t>::infinity())
      std::cout << " [" << birth << ", )" << std::endl;
    else if (death > birth * ratio)
      std::cout << " [" << birth << "," << death << ")" << std::endl;
  };
  if (format == SPARSE) {
    Sparse_distance_matrix dist =
      read_sparse_distance_matrix(filename ? file_stream : std::cin);
    std::cout << "sparse distance matrix with " << dist.size() << " points and "
      << dist.num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
      << std::endl;

    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else if (format == POINT_CLOUD && threshold < std::numeric_limits<value_t>::max()) {
    Sparse_distance_matrix dist(read_point_cloud(filename ? file_stream : std::cin), threshold);
    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else {
    Compressed_lower_distance_matrix dist =
      read_file(filename ? file_stream : std::cin, format);

    value_t min = std::numeric_limits<value_t>::infinity(),
            max = -std::numeric_limits<value_t>::infinity(), max_finite = max;
    std::size_t num_edges = 0;

    value_t enclosing_radius = std::numeric_limits<value_t>::infinity();
    if (threshold >= std::numeric_limits<value_t>::max()) {
      for (vertex_t i = 0; i < dist.size(); ++i) {
        value_t r_i = -std::numeric_limits<value_t>::infinity();
        for (vertex_t j = 0; j < dist.size(); ++j) r_i = std::max(r_i, dist(i, j));
        enclosing_radius = std::min(enclosing_radius, r_i);
      }
    }

    for (auto d : dist.distances) {
      min = std::min(min, d);
      max = std::max(max, d);
      if (d != std::numeric_limits<value_t>::infinity()) max_finite = std::max(max_finite, d);
      if (d <= threshold) ++num_edges;
    }
    std::cout << "value range: [" << min << "," << max_finite << "]" << std::endl;

    if (threshold >= std::numeric_limits<value_t>::max()) {
      std::cout << "distance matrix with " << dist.size()
        << " points, using threshold at enclosing radius " << enclosing_radius
        << std::endl;
      ripser(std::move(dist), dim_max, enclosing_radius, modulus, output_dim, output_pair);
    } else {
      std::cout << "sparse distance matrix with " << dist.size() << " points and "
        << num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
        << std::endl;

      ripser(Sparse_distance_matrix(std::move(dist), threshold), dim_max, threshold, modulus, output_dim, output_pair);
    }
  }
  return 0;
}